

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ec_pubkey_parse
              (secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *input,size_t inputlen)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  char *pcVar5;
  secp256k1_ge Q;
  secp256k1_fe local_d0;
  secp256k1_fe x_1;
  secp256k1_fe x;
  secp256k1_fe x3;
  
  if (pubkey == (secp256k1_pubkey *)0x0) {
    pvVar4 = (ctx->illegal_callback).data;
    pcVar5 = "pubkey != NULL";
  }
  else {
    pubkey->data[0x30] = '\0';
    pubkey->data[0x31] = '\0';
    pubkey->data[0x32] = '\0';
    pubkey->data[0x33] = '\0';
    pubkey->data[0x34] = '\0';
    pubkey->data[0x35] = '\0';
    pubkey->data[0x36] = '\0';
    pubkey->data[0x37] = '\0';
    pubkey->data[0x38] = '\0';
    pubkey->data[0x39] = '\0';
    pubkey->data[0x3a] = '\0';
    pubkey->data[0x3b] = '\0';
    pubkey->data[0x3c] = '\0';
    pubkey->data[0x3d] = '\0';
    pubkey->data[0x3e] = '\0';
    pubkey->data[0x3f] = '\0';
    pubkey->data[0x20] = '\0';
    pubkey->data[0x21] = '\0';
    pubkey->data[0x22] = '\0';
    pubkey->data[0x23] = '\0';
    pubkey->data[0x24] = '\0';
    pubkey->data[0x25] = '\0';
    pubkey->data[0x26] = '\0';
    pubkey->data[0x27] = '\0';
    pubkey->data[0x28] = '\0';
    pubkey->data[0x29] = '\0';
    pubkey->data[0x2a] = '\0';
    pubkey->data[0x2b] = '\0';
    pubkey->data[0x2c] = '\0';
    pubkey->data[0x2d] = '\0';
    pubkey->data[0x2e] = '\0';
    pubkey->data[0x2f] = '\0';
    pubkey->data[0x10] = '\0';
    pubkey->data[0x11] = '\0';
    pubkey->data[0x12] = '\0';
    pubkey->data[0x13] = '\0';
    pubkey->data[0x14] = '\0';
    pubkey->data[0x15] = '\0';
    pubkey->data[0x16] = '\0';
    pubkey->data[0x17] = '\0';
    pubkey->data[0x18] = '\0';
    pubkey->data[0x19] = '\0';
    pubkey->data[0x1a] = '\0';
    pubkey->data[0x1b] = '\0';
    pubkey->data[0x1c] = '\0';
    pubkey->data[0x1d] = '\0';
    pubkey->data[0x1e] = '\0';
    pubkey->data[0x1f] = '\0';
    pubkey->data[0] = '\0';
    pubkey->data[1] = '\0';
    pubkey->data[2] = '\0';
    pubkey->data[3] = '\0';
    pubkey->data[4] = '\0';
    pubkey->data[5] = '\0';
    pubkey->data[6] = '\0';
    pubkey->data[7] = '\0';
    pubkey->data[8] = '\0';
    pubkey->data[9] = '\0';
    pubkey->data[10] = '\0';
    pubkey->data[0xb] = '\0';
    pubkey->data[0xc] = '\0';
    pubkey->data[0xd] = '\0';
    pubkey->data[0xe] = '\0';
    pubkey->data[0xf] = '\0';
    if (input != (uchar *)0x0) {
      if (inputlen == 0x41) {
        bVar1 = *input;
        if (7 < bVar1) {
          return 0;
        }
        if ((0xd0U >> (bVar1 & 0x1f) & 1) == 0) {
          return 0;
        }
        iVar3 = secp256k1_fe_set_b32(&x_1,input + 1);
        iVar2 = 0;
        if ((iVar3 != 0) && (iVar3 = secp256k1_fe_set_b32(&local_d0,input + 0x21), iVar3 != 0)) {
          Q.infinity = 0;
          Q.x.n[0] = x_1.n[0];
          Q.x.n[1] = x_1.n[1];
          Q.x.n[2] = x_1.n[2];
          Q.x.n[3] = x_1.n[3];
          Q.x.n[4] = x_1.n[4];
          Q.y.n[1] = local_d0.n[1];
          Q.y.n[2] = local_d0.n[2];
          Q.y.n[3] = local_d0.n[3];
          Q.y.n[4] = local_d0.n[4];
          if (((bVar1 & 0xfe) != 6) || ((bVar1 != 7) != (bool)((byte)local_d0.n[0] & 1))) {
            secp256k1_fe_sqr(&x,&Q.y);
            secp256k1_fe_sqr(&x3,&Q.x);
            secp256k1_fe_mul(&x3,&x3,&Q.x);
            secp256k1_fe_add(&x3,&secp256k1_fe_const_b);
            secp256k1_fe_normalize_weak(&x3);
            iVar2 = secp256k1_fe_equal_var(&x,&x3);
          }
        }
      }
      else {
        if (inputlen != 0x21) {
          return 0;
        }
        bVar1 = *input;
        if ((bVar1 & 0xfe) != 2) {
          return 0;
        }
        iVar2 = secp256k1_fe_set_b32(&x,input + 1);
        if (iVar2 == 0) {
          iVar2 = 0;
        }
        else {
          iVar2 = secp256k1_ge_set_xo_var(&Q,&x,(uint)(bVar1 == 3));
        }
      }
      if (iVar2 == 0) {
        return 0;
      }
      secp256k1_pubkey_save(pubkey,&Q);
      secp256k1_ge_clear(&Q);
      return 1;
    }
    pvVar4 = (ctx->illegal_callback).data;
    pcVar5 = "input != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar5,pvVar4);
  return 0;
}

Assistant:

int secp256k1_ec_pubkey_parse(const secp256k1_context* ctx, secp256k1_pubkey* pubkey, const unsigned char *input, size_t inputlen) {
    secp256k1_ge Q;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    memset(pubkey, 0, sizeof(*pubkey));
    ARG_CHECK(input != NULL);
    if (!secp256k1_eckey_pubkey_parse(&Q, input, inputlen)) {
        return 0;
    }
    if (!secp256k1_ge_is_in_correct_subgroup(&Q)) {
        return 0;
    }
    secp256k1_pubkey_save(pubkey, &Q);
    secp256k1_ge_clear(&Q);
    return 1;
}